

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAnnotationObjectHelper.cc
# Opt level: O0

QPDFObjectHandle __thiscall
QPDFAnnotationObjectHelper::getAppearanceStream
          (QPDFAnnotationObjectHelper *this,string *which,string *state)

{
  bool bVar1;
  ulong uVar2;
  string *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObjectHandle QVar3;
  undefined1 local_78 [8];
  QPDFObjectHandle ap_sub;
  undefined1 local_58 [8];
  string desired_state;
  QPDFObjectHandle ap;
  string *state_local;
  string *which_local;
  QPDFAnnotationObjectHelper *this_local;
  QPDFObjectHandle *ap_sub_val;
  
  getAppearanceDictionary((QPDFAnnotationObjectHelper *)((long)&desired_state.field_2 + 8));
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::string((string *)local_58,in_RCX);
  }
  else {
    getAppearanceState_abi_cxx11_((string *)local_58,(QPDFAnnotationObjectHelper *)which);
  }
  bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)((long)&desired_state.field_2 + 8));
  if (bVar1) {
    QPDFObjectHandle::getKey
              ((QPDFObjectHandle *)local_78,(string *)((long)&desired_state.field_2 + 8));
    bVar1 = QPDFObjectHandle::isStream((QPDFObjectHandle *)local_78);
    if (bVar1) {
      QTC::TC("qpdf","QPDFAnnotationObjectHelper AP stream",0);
      QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)this,(QPDFObjectHandle *)local_78);
      bVar1 = true;
    }
    else {
      bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_78);
      if ((bVar1) && (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
        QTC::TC("qpdf","QPDFAnnotationObjectHelper AP dictionary",0);
        QPDFObjectHandle::getKey((QPDFObjectHandle *)this,(string *)local_78);
        bVar1 = QPDFObjectHandle::isStream((QPDFObjectHandle *)this);
        if (bVar1) {
          QTC::TC("qpdf","QPDFAnnotationObjectHelper AP sub stream",0);
          goto LAB_001be6bf;
        }
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)this);
      }
      bVar1 = false;
    }
LAB_001be6bf:
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_78);
    if (bVar1 != false) goto LAB_001be70a;
  }
  QTC::TC("qpdf","QPDFAnnotationObjectHelper AP null",0);
  QPDFObjectHandle::newNull();
LAB_001be70a:
  std::__cxx11::string::~string((string *)local_58);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)((long)&desired_state.field_2 + 8));
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFAnnotationObjectHelper::getAppearanceStream(std::string const& which, std::string const& state)
{
    QPDFObjectHandle ap = getAppearanceDictionary();
    std::string desired_state = state.empty() ? getAppearanceState() : state;
    if (ap.isDictionary()) {
        QPDFObjectHandle ap_sub = ap.getKey(which);
        if (ap_sub.isStream()) {
            // According to the spec, Appearance State is supposed to refer to a subkey of the
            // appearance stream when /AP is a dictionary, but files have been seen in the wild
            // where Appearance State is `/N` and `/AP` is a stream. Therefore, if `which` points to
            // a stream, disregard state and just use the stream. See qpdf issue #949 for details.
            QTC::TC("qpdf", "QPDFAnnotationObjectHelper AP stream");
            return ap_sub;
        }
        if (ap_sub.isDictionary() && (!desired_state.empty())) {
            QTC::TC("qpdf", "QPDFAnnotationObjectHelper AP dictionary");
            QPDFObjectHandle ap_sub_val = ap_sub.getKey(desired_state);
            if (ap_sub_val.isStream()) {
                QTC::TC("qpdf", "QPDFAnnotationObjectHelper AP sub stream");
                return ap_sub_val;
            }
        }
    }
    QTC::TC("qpdf", "QPDFAnnotationObjectHelper AP null");
    return QPDFObjectHandle::newNull();
}